

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXDocument.cpp
# Opt level: O0

void __thiscall Assimp::FBX::Document::ReadPropertyTemplates(Document *this)

{
  bool bVar1;
  Element *pEVar2;
  Scope *pSVar3;
  _Base_ptr this_00;
  reference ppVar4;
  const_reference ppTVar5;
  mapped_type *this_01;
  Token *t;
  Token *t_00;
  ElementCollection EVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  shared_ptr<const_Assimp::FBX::PropertyTable> local_278;
  undefined1 local_268 [8];
  shared_ptr<const_Assimp::FBX::PropertyTable> props;
  string local_250;
  Element *local_230;
  Element *Properties70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_208;
  string *pname;
  string local_1f8;
  vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_> *local_1d8;
  TokenList *tok_1;
  string local_1c8;
  Scope *local_1a8;
  Scope *sc_2;
  Element *el_1;
  const_iterator it_1;
  string local_188;
  Element *local_168;
  ElementCollection templs;
  string *oname;
  string local_128;
  vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_> *local_108;
  TokenList *tok;
  string local_f8;
  Scope *local_d8;
  Scope *sc_1;
  Element *el;
  const_iterator it;
  string local_b8;
  Element *local_98;
  ElementCollection otypes;
  Scope *sdefs;
  string local_78;
  allocator<char> local_41;
  string local_40;
  Element *local_20;
  Element *edefs;
  Scope *sc;
  Document *this_local;
  
  sc = (Scope *)this;
  pEVar2 = (Element *)Parser::GetRootScope(this->parser);
  edefs = pEVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"Definitions",&local_41);
  pEVar2 = Scope::operator[]((Scope *)pEVar2,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  local_20 = pEVar2;
  if ((pEVar2 == (Element *)0x0) || (pSVar3 = Element::Compound(pEVar2), pSVar3 == (Scope *)0x0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"no Definitions dictionary found",
               (allocator<char> *)((long)&sdefs + 7));
    Util::DOMWarning(&local_78,(Element *)0x0);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator((allocator<char> *)((long)&sdefs + 7));
  }
  else {
    this_00 = (_Base_ptr)Element::Compound(local_20);
    otypes.second._M_node = this_00;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"ObjectType",(allocator<char> *)((long)&it._M_node + 7));
    EVar6 = Scope::GetCollection((Scope *)this_00,&local_b8);
    otypes.first = EVar6.second._M_node;
    local_98 = (Element *)EVar6.first._M_node;
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&it._M_node + 7));
    el = local_98;
    while (bVar1 = std::operator!=((_Self *)&el,&otypes.first), bVar1) {
      ppVar4 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>
               ::operator*((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>
                            *)&el);
      sc_1 = (Scope *)ppVar4->second;
      local_d8 = Element::Compound((Element *)sc_1);
      if (local_d8 == (Scope *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f8,"expected nested scope in ObjectType, ignoring",
                   (allocator<char> *)((long)&tok + 7));
        Util::DOMWarning(&local_f8,(Element *)sc_1);
        std::__cxx11::string::~string((string *)&local_f8);
        std::allocator<char>::~allocator((allocator<char> *)((long)&tok + 7));
      }
      else {
        local_108 = Element::Tokens((Element *)sc_1);
        bVar1 = std::vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
                ::empty(local_108);
        if (bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_128,"expected name for ObjectType element, ignoring",
                     (allocator<char> *)((long)&oname + 7));
          Util::DOMWarning(&local_128,(Element *)sc_1);
          std::__cxx11::string::~string((string *)&local_128);
          std::allocator<char>::~allocator((allocator<char> *)((long)&oname + 7));
        }
        else {
          ppTVar5 = std::
                    vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
                    ::operator[](local_108,0);
          ParseTokenAsString_abi_cxx11_((string *)&templs.second,(FBX *)*ppTVar5,t);
          pSVar3 = local_d8;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_188,"PropertyTemplate",
                     (allocator<char> *)((long)&it_1._M_node + 7));
          EVar6 = Scope::GetCollection(pSVar3,&local_188);
          templs.first = EVar6.second._M_node;
          local_168 = (Element *)EVar6.first._M_node;
          std::__cxx11::string::~string((string *)&local_188);
          std::allocator<char>::~allocator((allocator<char> *)((long)&it_1._M_node + 7));
          el_1 = local_168;
          while (bVar1 = std::operator!=((_Self *)&el_1,&templs.first), bVar1) {
            ppVar4 = std::
                     _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>
                     ::operator*((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>
                                  *)&el_1);
            sc_2 = (Scope *)ppVar4->second;
            local_1a8 = Element::Compound((Element *)sc_2);
            if (local_1a8 == (Scope *)0x0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_1c8,"expected nested scope in PropertyTemplate, ignoring",
                         (allocator<char> *)((long)&tok_1 + 7));
              Util::DOMWarning(&local_1c8,(Element *)sc_2);
              std::__cxx11::string::~string((string *)&local_1c8);
              std::allocator<char>::~allocator((allocator<char> *)((long)&tok_1 + 7));
            }
            else {
              local_1d8 = Element::Tokens((Element *)sc_2);
              bVar1 = std::
                      vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
                      ::empty(local_1d8);
              if (bVar1) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_1f8,
                           "expected name for PropertyTemplate element, ignoring",
                           (allocator<char> *)((long)&pname + 7));
                Util::DOMWarning(&local_1f8,(Element *)sc_2);
                std::__cxx11::string::~string((string *)&local_1f8);
                std::allocator<char>::~allocator((allocator<char> *)((long)&pname + 7));
              }
              else {
                ppTVar5 = std::
                          vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
                          ::operator[](local_1d8,0);
                ParseTokenAsString_abi_cxx11_((string *)&Properties70,(FBX *)*ppTVar5,t_00);
                pSVar3 = local_1a8;
                local_208 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &Properties70;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_250,"Properties70",
                           (allocator<char> *)
                           ((long)&props.
                                   super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi + 7));
                pEVar2 = Scope::operator[](pSVar3,&local_250);
                std::__cxx11::string::~string((string *)&local_250);
                std::allocator<char>::~allocator
                          ((allocator<char> *)
                           ((long)&props.
                                   super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi + 7));
                local_230 = pEVar2;
                if (pEVar2 != (Element *)0x0) {
                  std::shared_ptr<Assimp::FBX::PropertyTable_const>::
                  shared_ptr<Assimp::FBX::PropertyTable_const,void>
                            ((shared_ptr<Assimp::FBX::PropertyTable_const> *)&local_278,
                             (PropertyTable *)0x0);
                  std::
                  make_shared<Assimp::FBX::PropertyTable_const,Assimp::FBX::Element_const&,std::shared_ptr<Assimp::FBX::PropertyTable_const>>
                            ((Element *)local_268,
                             (shared_ptr<const_Assimp::FBX::PropertyTable> *)pEVar2);
                  std::shared_ptr<const_Assimp::FBX::PropertyTable>::~shared_ptr(&local_278);
                  std::operator+(&local_2b8,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&templs.second,".");
                  std::operator+(&local_298,&local_2b8,local_208);
                  this_01 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_Assimp::FBX::PropertyTable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_Assimp::FBX::PropertyTable>_>_>_>
                            ::operator[](&this->templates,&local_298);
                  std::shared_ptr<const_Assimp::FBX::PropertyTable>::operator=
                            (this_01,(shared_ptr<const_Assimp::FBX::PropertyTable> *)local_268);
                  std::__cxx11::string::~string((string *)&local_298);
                  std::__cxx11::string::~string((string *)&local_2b8);
                  std::shared_ptr<const_Assimp::FBX::PropertyTable>::~shared_ptr
                            ((shared_ptr<const_Assimp::FBX::PropertyTable> *)local_268);
                }
                std::__cxx11::string::~string((string *)&Properties70);
              }
            }
            std::
            _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>
            ::operator++((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>
                          *)&el_1);
          }
          std::__cxx11::string::~string((string *)&templs.second);
        }
      }
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>
      ::operator++((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>
                    *)&el);
    }
  }
  return;
}

Assistant:

void Document::ReadPropertyTemplates()
{
    const Scope& sc = parser.GetRootScope();
    // read property templates from "Definitions" section
    const Element* const edefs = sc["Definitions"];
    if(!edefs || !edefs->Compound()) {
        DOMWarning("no Definitions dictionary found");
        return;
    }

    const Scope& sdefs = *edefs->Compound();
    const ElementCollection otypes = sdefs.GetCollection("ObjectType");
    for(ElementMap::const_iterator it = otypes.first; it != otypes.second; ++it) {
        const Element& el = *(*it).second;
        const Scope* sc = el.Compound();
        if(!sc) {
            DOMWarning("expected nested scope in ObjectType, ignoring",&el);
            continue;
        }

        const TokenList& tok = el.Tokens();
        if(tok.empty()) {
            DOMWarning("expected name for ObjectType element, ignoring",&el);
            continue;
        }

        const std::string& oname = ParseTokenAsString(*tok[0]);

        const ElementCollection templs = sc->GetCollection("PropertyTemplate");
        for(ElementMap::const_iterator it = templs.first; it != templs.second; ++it) {
            const Element& el = *(*it).second;
            const Scope* sc = el.Compound();
            if(!sc) {
                DOMWarning("expected nested scope in PropertyTemplate, ignoring",&el);
                continue;
            }

            const TokenList& tok = el.Tokens();
            if(tok.empty()) {
                DOMWarning("expected name for PropertyTemplate element, ignoring",&el);
                continue;
            }

            const std::string& pname = ParseTokenAsString(*tok[0]);

            const Element* Properties70 = (*sc)["Properties70"];
            if(Properties70) {
                std::shared_ptr<const PropertyTable> props = std::make_shared<const PropertyTable>(
                    *Properties70,std::shared_ptr<const PropertyTable>(static_cast<const PropertyTable*>(NULL))
                );

                templates[oname+"."+pname] = props;
            }
        }
    }
}